

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O2

void * t64watchfun(void *x)

{
  uint64_t uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  lVar5 = (long)cnum;
  uVar2 = *(uint *)((long)nva_cards[lVar5]->bar0 + (ulong)(uint)a);
  do {
    queue[put] = uVar2;
    uVar1 = get_time((uint)lVar5);
    tqueue64[put] = uVar1;
    put = (put + 1) % 0x100000;
    lVar5 = (long)cnum;
    uVar3 = uVar2;
    do {
      uVar2 = *(uint *)((long)nva_cards[lVar5]->bar0 + (ulong)(uint)a);
      uVar4 = uVar3 ^ uVar2;
      uVar3 = uVar2;
    } while ((uVar4 & mask) == 0);
  } while( true );
}

Assistant:

void *t64watchfun(void *x) {
	uint32_t val = nva_rd32(cnum, a);
	queue[put] = val;
	tqueue64[put] = get_time(cnum);
	put = (put + 1) % SZ;
	while (1) {
		uint32_t nval = nva_rd32(cnum, a);
		if ((nval & mask) != (val & mask)) {
			queue[put] = nval;
			tqueue64[put] = get_time(cnum);
			put = (put + 1) % SZ;
		}
		val = nval;
	}
}